

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  pointer pcVar3;
  undefined1 local_700 [8];
  ResultBuilder resultBuilder;
  TestCaseInfo testInfo;
  SectionStats testCaseSectionStats;
  Counts assertions;
  long *local_298;
  long local_290;
  long local_288 [2];
  undefined4 local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined4 local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined1 local_248;
  undefined1 local_110 [8];
  SectionInfo testCaseSection;
  Totals deltaTotals;
  string local_70;
  string local_50;
  
  ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_700,(this->m_lastAssertionInfo).macroName._M_dataplus._M_p,
             &(this->m_lastAssertionInfo).lineInfo,
             (this->m_lastAssertionInfo).capturedExpression._M_dataplus._M_p,
             (this->m_lastAssertionInfo).resultDisposition,"");
  resultBuilder.m_data.message.field_2._8_4_ = 0x210;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(resultBuilder.m_exprComponents.op.field_2._M_local_buf + 8),
             (message->_M_dataplus)._M_p,message->_M_string_length);
  ResultBuilder::captureExpression((ResultBuilder *)local_700);
  handleUnfinishedSections(this);
  _name = this->m_activeTestCase;
  SectionInfo::SectionInfo
            ((SectionInfo *)local_110,&(_name->super_TestCaseInfo).lineInfo,(string *)_name,
             &(_name->super_TestCaseInfo).description);
  testCaseSectionStats.missingAssertions = false;
  testCaseSectionStats._145_7_ = 0;
  assertions.failed = 0;
  assertions.passed = 1;
  SectionStats::SectionStats
            ((SectionStats *)&testInfo.properties,(SectionInfo *)local_110,
             (Counts *)&testCaseSectionStats.missingAssertions,0.0,false);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,&testInfo.properties);
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)&resultBuilder.m_shouldDebugBreak,
             &this->m_activeTestCase->super_TestCaseInfo);
  testCaseSection.lineInfo.line = 0;
  pIVar2 = (this->m_reporter).m_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)&assertions.failedButOk,
             (TestCaseInfo *)&resultBuilder.m_shouldDebugBreak,
             (Totals *)&testCaseSection.lineInfo.line,&local_70,&local_50,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])
            (pIVar2,&assertions.failedButOk);
  TestCaseStats::~TestCaseStats((TestCaseStats *)&assertions.failedButOk);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  assertions.failedButOk = (size_t)&local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&assertions.failedButOk,"");
  testGroupEnded(this,(string *)&assertions.failedButOk,&this->m_totals,1,1);
  if ((long *)assertions.failedButOk != &local_290) {
    operator_delete((void *)assertions.failedButOk,local_290 + 1);
  }
  pIVar2 = (this->m_reporter).m_p;
  assertions.failedButOk = (size_t)&PTR__TestRunStats_00169cf8;
  pcVar3 = (this->m_runInfo).name._M_dataplus._M_p;
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,pcVar3,pcVar3 + (this->m_runInfo).name._M_string_length);
  local_278 = (undefined4)(this->m_totals).assertions.passed;
  uStack_274 = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4);
  uStack_270 = (undefined4)(this->m_totals).assertions.failed;
  uStack_26c = *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4);
  local_268 = (undefined4)(this->m_totals).assertions.failedButOk;
  uStack_264 = *(undefined4 *)((long)&(this->m_totals).assertions.failedButOk + 4);
  uStack_260 = (undefined4)(this->m_totals).testCases.passed;
  uStack_25c = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  local_258 = (undefined4)(this->m_totals).testCases.failed;
  uStack_254 = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  uStack_250 = (undefined4)(this->m_totals).testCases.failedButOk;
  uStack_24c = *(undefined4 *)((long)&(this->m_totals).testCases.failedButOk + 4);
  local_248 = 0;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar2);
  assertions.failedButOk = (size_t)&PTR__TestRunStats_00169cf8;
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)&resultBuilder.m_shouldDebugBreak);
  SectionStats::~SectionStats((SectionStats *)&testInfo.properties);
  if ((size_type *)testCaseSection.description.field_2._8_8_ !=
      &testCaseSection.lineInfo.file._M_string_length) {
    operator_delete((void *)testCaseSection.description.field_2._8_8_,
                    testCaseSection.lineInfo.file._M_string_length + 1);
  }
  if ((size_type *)testCaseSection.name.field_2._8_8_ !=
      &testCaseSection.description._M_string_length) {
    operator_delete((void *)testCaseSection.name.field_2._8_8_,
                    testCaseSection.description._M_string_length + 1);
  }
  if (local_110 != (undefined1  [8])&testCaseSection.name._M_string_length) {
    operator_delete((void *)local_110,testCaseSection.name._M_string_length + 1);
  }
  ResultBuilder::~ResultBuilder((ResultBuilder *)local_700);
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) {
            ResultBuilder resultBuilder = makeUnexpectedResultBuilder();
            resultBuilder.setResultType( ResultWas::FatalErrorCondition );
            resultBuilder << message;
            resultBuilder.captureExpression();

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            TestCaseInfo testInfo = m_activeTestCase->getTestCaseInfo();

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        "",
                                                        "",
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( "", m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }